

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  string order_data;
  CPU RISC_V_CPU;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100 [16];
  string local_f0;
  CPU local_d0;
  
  CPU::CPU(&local_d0,1000000);
  local_110 = local_100;
  local_108 = 0;
  local_100[0] = 0;
  while( true ) {
    piVar1 = std::operator>>((istream *)&std::cin,(string *)&local_110);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::string((string *)&local_f0,(string *)&local_110);
    memory::push(&local_d0.CPU_MEM,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  CPU::run(&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  return 0;
}

Assistant:

int main() {
    CPU RISC_V_CPU;
    string order_data;
    int counter=0;
    while(cin>>order_data){
        RISC_V_CPU.CPU_MEM.push(order_data);
        ++counter;
    }
    RISC_V_CPU.run();
    return 0;
}